

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::TryFindExtensionInFallbackDatabase
          (DescriptorPool *this,Descriptor *containing_type,int field_number)

{
  int iVar1;
  Tables *this_00;
  FileDescriptor *pFVar2;
  bool bVar3;
  FileDescriptorProto file_proto;
  FileDescriptorProto FStack_f8;
  
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    return false;
  }
  FileDescriptorProto::FileDescriptorProto(&FStack_f8);
  iVar1 = (*this->fallback_database_->_vptr_DescriptorDatabase[4])
                    (this->fallback_database_,*(undefined8 *)(containing_type + 8),
                     (ulong)(uint)field_number,&FStack_f8);
  if ((char)iVar1 != '\0') {
    this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                        (&this->tables_);
    pFVar2 = Tables::FindFile(this_00,FStack_f8.name_.ptr_);
    if (pFVar2 == (FileDescriptor *)0x0) {
      pFVar2 = BuildFileFromDatabase(this,&FStack_f8);
      bVar3 = pFVar2 != (FileDescriptor *)0x0;
      goto LAB_002dd4be;
    }
  }
  bVar3 = false;
LAB_002dd4be:
  FileDescriptorProto::~FileDescriptorProto(&FStack_f8);
  return bVar3;
}

Assistant:

bool DescriptorPool::TryFindExtensionInFallbackDatabase(
    const Descriptor* containing_type, int field_number) const {
  if (fallback_database_ == NULL) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileContainingExtension(
        containing_type->full_name(), field_number, &file_proto)) {
    return false;
  }

  if (tables_->FindFile(file_proto.name()) != NULL) {
    // We've already loaded this file, and it apparently doesn't contain the
    // extension we're looking for.  Some DescriptorDatabases return false
    // positives.
    return false;
  }

  if (BuildFileFromDatabase(file_proto) == NULL) {
    return false;
  }

  return true;
}